

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void * xmlCatalogAddLocal(void *catalogs,xmlChar *URL)

{
  xmlCatalogEntryPtr pxVar1;
  xmlCatalogEntryPtr add;
  xmlCatalogEntryPtr catal;
  xmlChar *URL_local;
  void *catalogs_local;
  
  xmlInitParser();
  catalogs_local = catalogs;
  if (URL != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Adding document catalog %s\n",URL);
    }
    pxVar1 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,URL,(xmlChar *)0x0,
                                xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
    if ((pxVar1 != (xmlCatalogEntryPtr)0x0) &&
       (add = (xmlCatalogEntryPtr)catalogs, catalogs_local = pxVar1, catalogs != (void *)0x0)) {
      for (; add->next != (_xmlCatalogEntry *)0x0; add = add->next) {
      }
      add->next = pxVar1;
      catalogs_local = catalogs;
    }
  }
  return catalogs_local;
}

Assistant:

void *
xmlCatalogAddLocal(void *catalogs, const xmlChar *URL) {
    xmlCatalogEntryPtr catal, add;

    xmlInitParser();

    if (URL == NULL)
	return(catalogs);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Adding document catalog %s\n", URL);

    add = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL, URL, NULL,
	                     xmlCatalogDefaultPrefer, NULL);
    if (add == NULL)
	return(catalogs);

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return((void *) add);

    while (catal->next != NULL)
	catal = catal->next;
    catal->next = add;
    return(catalogs);
}